

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O0

Character ZXing::OneD::ReadDataCharacter(PatternView *view,bool outsideChar,bool rightPair)

{
  Character CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte in_DL;
  byte in_SIL;
  int gSum_1;
  int tOdd;
  int vEvn_1;
  int vOdd_1;
  int evnWidest_1;
  int oddWidest_1;
  int group_1;
  int evnSum;
  int gSum;
  int tEvn;
  int vEvn;
  int vOdd;
  int evnWidest;
  int oddWidest;
  int group;
  int oddSum;
  int checksumPortion;
  anon_class_1_0_00000001 calcChecksumPortion;
  Array4I evnPattern;
  Array4I oddPattern;
  int INSIDE_ODD_WIDEST [4];
  int OUTSIDE_ODD_WIDEST [5];
  int INSIDE_GSUM [4];
  int OUTSIDE_GSUM [5];
  int INSIDE_ODD_TOTAL_SUBSET [4];
  int OUTSIDE_EVEN_TOTAL_SUBSET [5];
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 noNarrow;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  Array4I *evnPattern_00;
  Array4I *oddPattern_00;
  undefined8 uVar6;
  PatternView *view_00;
  int local_38 [9];
  byte local_12;
  byte local_11;
  int local_8;
  int iStack_4;
  
  noNarrow = (undefined1)((uint)in_stack_ffffffffffffff18 >> 0x18);
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_38[4] = 1;
  local_38[5] = 10;
  local_38[6] = 0x22;
  local_38[7] = 0x46;
  local_38[8] = 0x7e;
  local_38[0] = 4;
  local_38[1] = 0x14;
  local_38[2] = 0x30;
  local_38[3] = 0x51;
  uVar6 = 0xa100000000;
  view_00 = (PatternView *)0x7df000003c1;
  evnPattern_00 = (Array4I *)0x15000000000;
  oddPattern_00 = (Array4I *)0x5ec0000040c;
  local_88 = 0x600000008;
  local_80 = 0x300000004;
  local_78 = 1;
  local_98 = 0x400000002;
  local_90 = 0x800000006;
  memset(local_a8,0,0x10);
  memset(local_b8,0,0x10);
  bVar2 = DataBar::ReadDataCharacterRaw
                    (view_00,(int)((ulong)uVar6 >> 0x20),SUB81((ulong)uVar6 >> 0x18,0),oddPattern_00
                     ,evnPattern_00);
  if (bVar2) {
    iVar3 = ReadDataCharacter::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (Array4I *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar4 = ReadDataCharacter::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (Array4I *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar3 = iVar3 + iVar4 * 3;
    iStack_4 = iVar3;
    if ((local_11 & 1) == 0) {
      iVar4 = Reduce<std::array<int,4ul>,int,std::plus<int>>(local_b8,0);
      iVar3 = (10 - iVar4) / 2;
      iVar5 = DataBar::GetValue((Array4I *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,SUB41((uint)iVar4 >> 0x18,0));
      iVar4 = DataBar::GetValue((Array4I *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,SUB41((uint)iVar4 >> 0x18,0));
      local_8 = iVar4 * local_38[iVar3] + iVar5 +
                *(int *)(&stack0xffffffffffffff98 + (long)iVar3 * 4);
    }
    else {
      iVar4 = Reduce<std::array<int,4ul>,int,std::plus<int>>(local_a8,0);
      iVar4 = (0xc - iVar4) / 2;
      iVar3 = DataBar::GetValue((Array4I *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,(bool)noNarrow);
      iVar5 = DataBar::GetValue((Array4I *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c,(bool)noNarrow);
      local_8 = iVar3 * local_38[(long)iVar4 + 4] + iVar5 +
                *(int *)(&stack0xffffffffffffffa8 + (long)iVar4 * 4);
    }
  }
  else {
    local_8 = -1;
    iStack_4 = 0;
  }
  CVar1.checksum = iStack_4;
  CVar1.value = local_8;
  return CVar1;
}

Assistant:

static Character ReadDataCharacter(const PatternView& view, bool outsideChar, bool rightPair)
{
	constexpr int OUTSIDE_EVEN_TOTAL_SUBSET[] = {1, 10, 34, 70, 126};
	constexpr int INSIDE_ODD_TOTAL_SUBSET[]   = {4, 20, 48, 81};
	constexpr int OUTSIDE_GSUM[]              = {0, 161, 961, 2015, 2715};
	constexpr int INSIDE_GSUM[]               = {0, 336, 1036, 1516};
	constexpr int OUTSIDE_ODD_WIDEST[]        = {8, 6, 4, 3, 1};
	constexpr int INSIDE_ODD_WIDEST[]         = {2, 4, 6, 8};

	Array4I oddPattern = {}, evnPattern = {};
	if (!ReadDataCharacterRaw(view, outsideChar ? 16 : 15, outsideChar == rightPair, oddPattern, evnPattern))
		return {};

	auto calcChecksumPortion = [](const Array4I& counts) {
		int res = 0;
		for (auto it = counts.rbegin(); it != counts.rend(); ++it)
			res = 9 * res + *it;
		return res;
	};

	int checksumPortion = calcChecksumPortion(oddPattern) + 3 * calcChecksumPortion(evnPattern);

	if (outsideChar) {
		int oddSum = Reduce(oddPattern);
		assert((oddSum & 1) == 0 && oddSum <= 12 && oddSum >= 4); // checked in ReadDataCharacterRaw
		int group = (12 - oddSum) / 2;
		int oddWidest = OUTSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, false);
		int vEvn = GetValue(evnPattern, evnWidest, true);
		int tEvn = OUTSIDE_EVEN_TOTAL_SUBSET[group];
		int gSum = OUTSIDE_GSUM[group];
		return {vOdd * tEvn + vEvn + gSum, checksumPortion};
	} else {
		int evnSum = Reduce(evnPattern);
		assert((evnSum & 1) == 0 && evnSum <= 12 && evnSum >= 4); // checked in ReadDataCharacterRaw
		int group = (10 - evnSum) / 2;
		int oddWidest = INSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, true);
		int vEvn = GetValue(evnPattern, evnWidest, false);
		int tOdd = INSIDE_ODD_TOTAL_SUBSET[group];
		int gSum = INSIDE_GSUM[group];
		return {vEvn * tOdd + vOdd + gSum, checksumPortion};
	}
}